

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_setlocal(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  TValue *pTVar2;
  int32_t iVar3;
  int iVar4;
  TValue *pTVar5;
  char *str;
  uint uVar6;
  lua_State *L_00;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  uVar6 = 0;
  L_00 = L;
  if ((L->base < L->top) && (aVar1 = L->base->field_4, aVar1.it >> 0xf == 0x1fff9)) {
    uVar6 = 1;
    L_00 = (lua_State *)((ulong)aVar1 & 0x7fffffffffff);
  }
  iVar3 = lj_lib_checkint(L,uVar6 + 1);
  iVar4 = lua_getstack(L_00,iVar3,&lStack_98);
  if (iVar4 == 0) {
    lj_err_arg(L,uVar6 + 1,LJ_ERR_LVLRNG);
  }
  pTVar5 = lj_lib_checkany(L,uVar6 + 3);
  pTVar2 = L_00->top;
  L_00->top = pTVar2 + 1;
  *pTVar2 = *pTVar5;
  iVar3 = lj_lib_checkint(L,uVar6 | 2);
  str = lua_setlocal(L_00,&lStack_98,iVar3);
  lua_pushstring(L,str);
  return 1;
}

Assistant:

LJLIB_CF(debug_setlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  TValue *tv;
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  tv = lj_lib_checkany(L, arg+3);
  copyTV(L1, L1->top++, tv);
  lua_pushstring(L, lua_setlocal(L1, &ar, lj_lib_checkint(L, arg+2)));
  return 1;
}